

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O2

void __thiscall trng::mt19937::mt19937(mt19937 *this)

{
  memset(&this->S,0,0x9c4);
  seed(this,0x1571);
  return;
}

Assistant:

mt19937::mt19937() { seed(5489u); }